

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

void mtree_quote(archive_string *s,char *str)

{
  byte *pbVar1;
  byte bVar2;
  ulong in_RAX;
  char *pcVar3;
  byte *pbVar4;
  char buf [4];
  undefined8 uStack_38;
  
  bVar2 = *str;
  pbVar4 = (byte *)str;
  uStack_38 = in_RAX;
  if (bVar2 != 0) {
    pcVar3 = str;
    pbVar1 = (byte *)(str + 1);
    do {
      pbVar4 = pbVar1;
      if (""[bVar2] == '\0') {
        if (pbVar4 + -1 != (byte *)str) {
          archive_strncat(s,str,(long)pcVar3 - (long)str);
        }
        bVar2 = pbVar4[-1];
        uStack_38._0_5_ = CONCAT14(0x5c,(undefined4)uStack_38);
        uStack_38 = CONCAT17(bVar2,CONCAT16(bVar2 >> 3,CONCAT15(bVar2 >> 6,(undefined5)uStack_38)))
                    & 0x707ffffffffffff | 0x3030300000000000;
        archive_strncat(s,(void *)((long)&uStack_38 + 4),4);
        str = (char *)pbVar4;
      }
      bVar2 = *pbVar4;
      pcVar3 = pcVar3 + 1;
      pbVar1 = pbVar4 + 1;
    } while (bVar2 != 0);
  }
  if ((byte *)str != pbVar4) {
    archive_strncat(s,str,(long)pbVar4 - (long)str);
  }
  return;
}

Assistant:

static void
mtree_quote(struct archive_string *s, const char *str)
{
	const char *start;
	char buf[4];
	unsigned char c;

	for (start = str; *str != '\0'; ++str) {
		if (safe_char[*(const unsigned char *)str])
			continue;
		if (start != str)
			archive_strncat(s, start, str - start);
		c = (unsigned char)*str;
		buf[0] = '\\';
		buf[1] = (c / 64) + '0';
		buf[2] = (c / 8 % 8) + '0';
		buf[3] = (c % 8) + '0';
		archive_strncat(s, buf, 4);
		start = str + 1;
	}

	if (start != str)
		archive_strncat(s, start, str - start);
}